

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O1

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_projection
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  DenseStorage<float,_16,_4,_4,_0> *pDVar6;
  Matrix4<float> *result;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if (this->camera_type == Orthographic) {
    fVar7 = (this->frustum).l;
    fVar1 = (this->frustum).r;
    fVar2 = (this->frustum).b;
    fVar3 = (this->frustum).t;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[1] = 0.0;
    (pDVar6->m_data).array[2] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[3] = 0.0;
    (pDVar6->m_data).array[4] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[6] = 0.0;
    (pDVar6->m_data).array[7] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[8] = 0.0;
    (pDVar6->m_data).array[9] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[0xb] = 0.0;
    (pDVar6->m_data).array[0xc] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[0xd] = 0.0;
    (pDVar6->m_data).array[0xe] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xf] = 1.0;
    fVar8 = fVar1 - fVar7;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 2.0 / fVar8;
    fVar9 = fVar3 - fVar2;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 2.0 / fVar9;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[10] = -1.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xc] = -(fVar7 + fVar1) / fVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xd] = -(fVar2 + fVar3) / fVar9;
  }
  else {
    if ((this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float>._M_engaged == false) {
      __assert_fail("fov_y.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xfd,
                    "Eigen::Matrix4f eos::fitting::RenderingParameters::get_projection() const");
    }
    iVar4 = this->screen_width;
    iVar5 = this->screen_height;
    fVar7 = tanf((this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
                 super__Optional_payload_base<float>._M_payload._M_value * 0.5);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[1] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[2] = 0.0;
    (pDVar6->m_data).array[3] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[4] = 0.0;
    (pDVar6->m_data).array[5] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[6] = 0.0;
    (pDVar6->m_data).array[7] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[8] = 0.0;
    (pDVar6->m_data).array[9] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[10] = 0.0;
    (pDVar6->m_data).array[0xb] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[0xc] = 0.0;
    (pDVar6->m_data).array[0xd] = 0.0;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[0xe] = 0.0;
    (pDVar6->m_data).array[0xf] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 1.0 / (((float)iVar4 / (float)iVar5) * fVar7);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 1.0 / fVar7;
    pDVar6 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar6->m_data).array[10] = -1.0001999;
    (pDVar6->m_data).array[0xb] = -1.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xe] = -0.20002;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_projection() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            const auto ortho = render::ortho(frustum.l, frustum.r, frustum.b, frustum.t);
            return ortho;
        } else
        {
            assert(fov_y.has_value()); // Might be worth throwing an exception instead.
            const float aspect_ratio = static_cast<double>(screen_width) / screen_height;
            const auto persp_mtx = render::perspective(fov_y.value(), aspect_ratio, 0.1f, 1000.0f);
            return persp_mtx;
        }
    }